

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::FileOrDirectoryExists(FilePath *this)

{
  int iVar1;
  char *path;
  long in_FS_OFFSET;
  FilePath *this_local;
  StatStruct file_stat;
  
  file_stat.__glibc_reserved[2] = *(__syscall_slong_t *)(in_FS_OFFSET + 0x28);
  path = (char *)std::__cxx11::string::c_str();
  iVar1 = posix::Stat(path,(StatStruct *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == file_stat.__glibc_reserved[2]) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::FileOrDirectoryExists() const {
#if GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(pathname_.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete [] unicode;
  return attributes != kInvalidFileAttributes;
#else
  posix::StatStruct file_stat;
  return posix::Stat(pathname_.c_str(), &file_stat) == 0;
#endif  // GTEST_OS_WINDOWS_MOBILE
}